

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGroupAddMetricExp
          (zet_metric_group_handle_t hMetricGroup,zet_metric_handle_t hMetric,
          size_t *pErrorStringSize,char *pErrorString)

{
  zet_pfnMetricGroupAddMetricExp_t pfnAddMetricExp;
  ze_result_t result;
  char *pErrorString_local;
  size_t *pErrorStringSize_local;
  zet_metric_handle_t hMetric_local;
  zet_metric_group_handle_t hMetricGroup_local;
  
  pfnAddMetricExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c8c8 != (code *)0x0) {
    pfnAddMetricExp._4_4_ = (*DAT_0011c8c8)(hMetricGroup,hMetric,pErrorStringSize,pErrorString);
  }
  return pfnAddMetricExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupAddMetricExp(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] Handle of the metric group
        zet_metric_handle_t hMetric,                    ///< [in] Metric to be added to the group.
        size_t * pErrorStringSize,                      ///< [in,out][optional] Size of the error string to query, if an error was
                                                        ///< reported during adding the metric handle.
                                                        ///< if *pErrorStringSize is zero, then the driver shall update the value
                                                        ///< with the size of the error string in bytes.
        char* pErrorString                              ///< [in,out][optional][range(0, *pErrorStringSize)] Error string.
                                                        ///< if *pErrorStringSize is less than the length of the error string
                                                        ///< available, then driver shall only retrieve that length of error string.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAddMetricExp = context.zetDdiTable.MetricGroupExp.pfnAddMetricExp;
        if( nullptr != pfnAddMetricExp )
        {
            result = pfnAddMetricExp( hMetricGroup, hMetric, pErrorStringSize, pErrorString );
        }
        else
        {
            // generic implementation
        }

        return result;
    }